

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationGeometryPassthroughTests.cpp
# Opt level: O3

TestCaseGroup * vkt::tessellation::createGeometryPassthroughTests(TestContext *testCtx)

{
  TestNode *this;
  TestNode *pTVar1;
  
  this = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this,testCtx,"passthrough",
             "Render various types with either passthrough geometry or tessellation shader");
  pTVar1 = (TestNode *)
           anon_unknown_2::makeIdentityGeometryShaderCase(testCtx,TESSPRIMITIVETYPE_TRIANGLES);
  tcu::TestNode::addChild(this,pTVar1);
  pTVar1 = (TestNode *)
           anon_unknown_2::makeIdentityGeometryShaderCase(testCtx,TESSPRIMITIVETYPE_QUADS);
  tcu::TestNode::addChild(this,pTVar1);
  pTVar1 = (TestNode *)
           anon_unknown_2::makeIdentityGeometryShaderCase(testCtx,TESSPRIMITIVETYPE_ISOLINES);
  tcu::TestNode::addChild(this,pTVar1);
  pTVar1 = (TestNode *)
           anon_unknown_2::makeIdentityTessellationShaderCase(testCtx,TESSPRIMITIVETYPE_TRIANGLES);
  tcu::TestNode::addChild(this,pTVar1);
  pTVar1 = (TestNode *)
           anon_unknown_2::makeIdentityTessellationShaderCase(testCtx,TESSPRIMITIVETYPE_ISOLINES);
  tcu::TestNode::addChild(this,pTVar1);
  return (TestCaseGroup *)this;
}

Assistant:

tcu::TestCaseGroup* createGeometryPassthroughTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> group (new tcu::TestCaseGroup(testCtx, "passthrough", "Render various types with either passthrough geometry or tessellation shader"));

	// Passthrough geometry shader
	group->addChild(makeIdentityGeometryShaderCase(testCtx, TESSPRIMITIVETYPE_TRIANGLES));
	group->addChild(makeIdentityGeometryShaderCase(testCtx, TESSPRIMITIVETYPE_QUADS));
	group->addChild(makeIdentityGeometryShaderCase(testCtx, TESSPRIMITIVETYPE_ISOLINES));

	// Passthrough tessellation shader
	group->addChild(makeIdentityTessellationShaderCase(testCtx, TESSPRIMITIVETYPE_TRIANGLES));
	group->addChild(makeIdentityTessellationShaderCase(testCtx, TESSPRIMITIVETYPE_ISOLINES));

	return group.release();
}